

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_assign(event *ev,event_base *base,int fd,short events,
                _func_void_int_short_void_ptr *callback,void *arg)

{
  event_debug_entry *peVar1;
  ulong uVar2;
  event_debug_entry **ppeVar3;
  uint uVar4;
  event_debug_entry *peVar5;
  uint u;
  
  if (base == (event_base *)0x0) {
    base = event_global_current_base_;
  }
  if ((void **)arg == &event_self_cbarg_ptr_) {
    arg = ev;
  }
  if (((((events & 8U) == 0) && (-1 < fd)) && (event_debug_mode_on_ != 0)) &&
     (uVar4 = fcntl(fd,3,0), (uVar4 & 0x80000800) == 0)) {
    event_assign_cold_1();
LAB_001e0951:
    event_err(1,"Out of memory in debugging code");
  }
  event_debug_assert_not_added_(ev);
  ev->ev_base = base;
  (ev->ev_evcallback).evcb_cb_union.evcb_callback = callback;
  (ev->ev_evcallback).evcb_arg = arg;
  ev->ev_fd = fd;
  ev->ev_events = events;
  ev->ev_res = 0;
  (ev->ev_evcallback).evcb_flags = 0x80;
  (ev->ev_).ev_signal.ev_ncalls = 0;
  (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
  if ((events & 8U) == 0) {
    if ((events & 0x10U) == 0) {
      (ev->ev_evcallback).evcb_closure = '\0';
    }
    else {
      (ev->ev_).ev_io.ev_timeout.tv_sec = 0;
      (ev->ev_).ev_io.ev_timeout.tv_usec = 0;
      (ev->ev_evcallback).evcb_closure = '\x02';
    }
  }
  else {
    if ((events & 0x86U) != 0) {
      event_warnx("%s: EV_SIGNAL is not compatible with EV_READ, EV_WRITE or EV_CLOSED",
                  "event_assign");
      return -1;
    }
    (ev->ev_evcallback).evcb_closure = '\x01';
  }
  (ev->ev_timeout_pos).min_heap_idx = -1;
  if (base != (event_base *)0x0) {
    (ev->ev_evcallback).evcb_pri =
         (uint8_t)((uint)(base->nactivequeues - (base->nactivequeues >> 0x1f)) >> 1);
  }
  if (event_debug_mode_on_ != 0) {
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
    }
    if (global_debug_map.hth_table == (event_debug_entry **)0x0) {
      peVar5 = (event_debug_entry *)0x0;
    }
    else {
      peVar1 = (event_debug_entry *)
               (global_debug_map.hth_table +
               ((ulong)ev >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length);
      do {
        peVar5 = peVar1;
        peVar1 = (peVar5->node).hte_next;
        if (peVar1 == (event_debug_entry *)0x0) break;
      } while (peVar1->ptr != ev);
    }
    if (peVar5 == (event_debug_entry *)0x0) {
      peVar5 = (event_debug_entry *)0x0;
    }
    else {
      peVar5 = (peVar5->node).hte_next;
    }
    if (peVar5 == (event_debug_entry *)0x0) {
      if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
        peVar5 = (event_debug_entry *)malloc(0x18);
      }
      else {
        peVar5 = (event_debug_entry *)(*mm_malloc_fn_)(0x18);
      }
      if (peVar5 == (event_debug_entry *)0x0) goto LAB_001e0951;
      peVar5->ptr = ev;
      peVar5->field_0x10 = peVar5->field_0x10 & 0xfe;
      if ((global_debug_map.hth_table == (event_debug_entry **)0x0) ||
         (global_debug_map.hth_load_limit <= global_debug_map.hth_n_entries)) {
        event_debug_map_HT_GROW(&global_debug_map,global_debug_map.hth_n_entries + 1);
      }
      ppeVar3 = global_debug_map.hth_table;
      global_debug_map.hth_n_entries = global_debug_map.hth_n_entries + 1;
      uVar2 = (ulong)(*(uint *)&peVar5->ptr >> 6) % (ulong)global_debug_map.hth_table_length;
      (peVar5->node).hte_next = global_debug_map.hth_table[uVar2];
      ppeVar3[uVar2] = peVar5;
    }
    else {
      peVar5->field_0x10 = peVar5->field_0x10 & 0xfe;
    }
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
    }
  }
  event_debug_mode_too_late = 1;
  return 0;
}

Assistant:

int
event_assign(struct event *ev, struct event_base *base, evutil_socket_t fd, short events, void (*callback)(evutil_socket_t, short, void *), void *arg)
{
	if (!base)
		base = current_base;
	if (arg == &event_self_cbarg_ptr_)
		arg = ev;

	if (!(events & EV_SIGNAL))
		event_debug_assert_socket_nonblocking_(fd);
	event_debug_assert_not_added_(ev);

	ev->ev_base = base;

	ev->ev_callback = callback;
	ev->ev_arg = arg;
	ev->ev_fd = fd;
	ev->ev_events = events;
	ev->ev_res = 0;
	ev->ev_flags = EVLIST_INIT;
	ev->ev_ncalls = 0;
	ev->ev_pncalls = NULL;

	if (events & EV_SIGNAL) {
		if ((events & (EV_READ|EV_WRITE|EV_CLOSED)) != 0) {
			event_warnx("%s: EV_SIGNAL is not compatible with "
			    "EV_READ, EV_WRITE or EV_CLOSED", __func__);
			return -1;
		}
		ev->ev_closure = EV_CLOSURE_EVENT_SIGNAL;
	} else {
		if (events & EV_PERSIST) {
			evutil_timerclear(&ev->ev_io_timeout);
			ev->ev_closure = EV_CLOSURE_EVENT_PERSIST;
		} else {
			ev->ev_closure = EV_CLOSURE_EVENT;
		}
	}

	min_heap_elem_init_(ev);

	if (base != NULL) {
		/* by default, we put new events into the middle priority */
		ev->ev_pri = base->nactivequeues / 2;
	}

	event_debug_note_setup_(ev);

	return 0;
}